

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.h
# Opt level: O0

int64_t __thiscall CBlockIndex::GetMedianTimePast(CBlockIndex *this)

{
  int64_t iVar1;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  CBlockIndex *pindex;
  int64_t *pend;
  int64_t *pbegin;
  int64_t pmedian [11];
  CBlockIndex *in_stack_ffffffffffffff68;
  int local_8c;
  long local_88;
  long *__last;
  long *__first;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __last = &local_10;
  local_88 = in_RDI;
  __first = &local_10;
  for (local_8c = 0; local_8c < 0xb && local_88 != 0; local_8c = local_8c + 1) {
    iVar1 = GetBlockTime(in_stack_ffffffffffffff68);
    __first[-1] = iVar1;
    local_88 = *(long *)(local_88 + 8);
    __first = __first + -1;
  }
  std::sort<long*>(__first,__last);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return *(int64_t *)
            ((long)__first +
            (((long)__last - (long)__first >> 3) - ((long)__last - (long)__first >> 0x3f) &
            0xfffffffffffffffeU) * 4);
  }
  __stack_chk_fail();
}

Assistant:

int64_t GetMedianTimePast() const
    {
        int64_t pmedian[nMedianTimeSpan];
        int64_t* pbegin = &pmedian[nMedianTimeSpan];
        int64_t* pend = &pmedian[nMedianTimeSpan];

        const CBlockIndex* pindex = this;
        for (int i = 0; i < nMedianTimeSpan && pindex; i++, pindex = pindex->pprev)
            *(--pbegin) = pindex->GetBlockTime();

        std::sort(pbegin, pend);
        return pbegin[(pend - pbegin) / 2];
    }